

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O1

void RescalerImportRowShrink_SSE2(WebPRescaler *wrk,uint8_t *src)

{
  undefined7 uVar1;
  undefined1 auVar2 [12];
  undefined1 auVar3 [12];
  unkbyte10 Var4;
  unkbyte10 Var5;
  int iVar6;
  ulong uVar7;
  rescaler_t *prVar8;
  ulong uVar9;
  rescaler_t *prVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar24;
  byte bVar27;
  short sVar28;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar29 [16];
  undefined4 uVar31;
  short sVar32;
  undefined1 auVar30 [16];
  undefined4 uVar33;
  
  if ((wrk->num_channels == 4) && (uVar11 = wrk->x_sub, wrk->x_add <= (int)(uVar11 * 0x80))) {
    if (0 < wrk->dst_width) {
      auVar20 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
      auVar21._0_4_ = auVar20._0_4_;
      auVar21._4_4_ = auVar21._0_4_;
      auVar21._8_4_ = auVar21._0_4_;
      auVar21._12_4_ = auVar21._0_4_;
      uVar18 = wrk->fx_scale;
      prVar10 = wrk->frow;
      prVar8 = prVar10 + (long)wrk->dst_width * 4;
      iVar13 = 0;
      auVar22 = (undefined1  [16])0x0;
      do {
        bVar19 = SCARRY4(iVar13,wrk->x_add);
        iVar13 = iVar13 + wrk->x_add;
        auVar26 = auVar22;
        if (iVar13 == 0 || bVar19 != iVar13 < 0) {
          auVar25 = (undefined1  [16])0x0;
        }
        else {
          do {
            uVar31 = *(undefined4 *)src;
            src = src + 4;
            bVar27 = (byte)((uint)uVar31 >> 0x18);
            uVar1 = CONCAT25((short)(((uint7)bVar27 << 0x30) >> 0x28),
                             CONCAT14((char)((uint)uVar31 >> 0x10),uVar31));
            uVar24 = (ushort)uVar31;
            uVar7 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar1 >> 0x20),uVar31) >> 0x18),
                                    CONCAT12((char)((uint)uVar31 >> 8),uVar24)) & 0xffffffff00ffffff
            ;
            auVar25._8_8_ = 0;
            auVar25._0_8_ = CONCAT62((int6)(uVar7 >> 0x10),uVar24) & 0xffffffffffff00ff;
            auVar22._0_2_ = auVar26._0_2_ + (uVar24 & 0xff);
            auVar22._2_2_ = auVar26._2_2_ + (short)(uVar7 >> 0x10);
            auVar22._4_2_ = auVar26._4_2_ + (short)((uint7)uVar1 >> 0x20);
            auVar22._6_2_ = auVar26._6_2_ + (ushort)bVar27;
            auVar22._8_2_ = auVar26._8_2_;
            auVar22._10_2_ = auVar26._10_2_;
            auVar22._12_2_ = auVar26._12_2_;
            auVar22._14_2_ = auVar26._14_2_;
            iVar13 = iVar13 - uVar11;
            auVar26 = auVar22;
          } while (0 < iVar13);
        }
        auVar29 = pshuflw(ZEXT416((uint)-iVar13),ZEXT416((uint)-iVar13),0);
        auVar26._0_4_ = auVar29._0_4_;
        auVar26._4_4_ = auVar26._0_4_;
        auVar26._8_4_ = auVar26._0_4_;
        auVar26._12_4_ = auVar26._0_4_;
        sVar32 = auVar29._2_2_ * auVar25._6_2_;
        auVar26 = pmulhuw(auVar25,auVar26);
        iVar14 = CONCAT22(auVar26._6_2_,sVar32);
        Var4 = CONCAT64(CONCAT42(iVar14,auVar26._4_2_),
                        CONCAT22(auVar29._0_2_ * auVar25._4_2_,sVar32));
        uVar7 = (ulong)((unkuint10)Var4 >> 0x10);
        auVar2._4_8_ = uVar7;
        auVar2._2_2_ = auVar26._2_2_;
        auVar2._0_2_ = auVar29._2_2_ * auVar25._2_2_;
        auVar30._0_4_ = CONCAT22(auVar26._0_2_,auVar29._0_2_ * auVar25._0_2_);
        auVar30._4_12_ = auVar2;
        sVar32 = auVar22._0_2_;
        sVar28 = auVar22._6_2_ * auVar20._2_2_;
        auVar26 = pmulhuw(auVar22,auVar21);
        iVar6 = CONCAT22(auVar26._6_2_,sVar28);
        Var5 = CONCAT64(CONCAT42(iVar6,auVar26._4_2_),CONCAT22(auVar22._4_2_ * auVar20._0_2_,sVar28)
                       );
        auVar3._4_8_ = (long)((unkuint10)Var5 >> 0x10);
        auVar3._2_2_ = auVar26._2_2_;
        auVar3._0_2_ = auVar22._2_2_ * auVar20._2_2_;
        uVar31 = (undefined4)((ulong)auVar30._0_4_ * (ulong)uVar18 + 0x80000000 >> 0x20);
        uVar33 = (undefined4)((uVar7 & 0xffffffff) * (ulong)uVar18 + 0x80000000 >> 0x20);
        auVar23._4_4_ = uVar33;
        auVar23._0_4_ = uVar31;
        auVar23._8_4_ = uVar33;
        auVar23._12_4_ = (int)((uVar7 >> 0x20) * (ulong)uVar18 + 0x80000000 >> 0x20);
        auVar29._8_8_ = auVar23._8_8_;
        auVar29._4_4_ = (int)((auVar30._0_8_ >> 0x20) * (ulong)uVar18 + 0x80000000 >> 0x20);
        auVar29._0_4_ = uVar31;
        auVar22 = packssdw(auVar29,(undefined1  [16])0x0);
        *prVar10 = CONCAT22(auVar26._0_2_,sVar32 * auVar20._0_2_) - auVar30._0_4_;
        prVar10[1] = auVar3._0_4_ - auVar2._0_4_;
        prVar10[2] = (int)((unkuint10)Var5 >> 0x10) - (int)((unkuint10)Var4 >> 0x10);
        prVar10[3] = iVar6 - iVar14;
        prVar10 = prVar10 + 4;
      } while (prVar10 < prVar8);
    }
    return;
  }
  uVar7 = (ulong)wrk->num_channels;
  if (0 < (long)uVar7) {
    iVar13 = wrk->dst_width * wrk->num_channels;
    uVar9 = 0;
    do {
      if ((int)uVar9 < iVar13) {
        prVar10 = wrk->frow;
        iVar14 = 0;
        uVar12 = 0;
        uVar16 = uVar9 & 0xffffffff;
        uVar15 = uVar9;
        do {
          uVar11 = (uint)uVar12;
          bVar19 = SCARRY4(iVar14,wrk->x_add);
          iVar14 = iVar14 + wrk->x_add;
          if (iVar14 == 0 || bVar19 != iVar14 < 0) {
            uVar18 = 0;
          }
          else {
            lVar17 = 0;
            do {
              iVar14 = iVar14 - wrk->x_sub;
              uVar18 = (uint)src[lVar17 + (int)uVar16];
              uVar11 = (int)uVar12 + (uint)src[lVar17 + (int)uVar16];
              uVar12 = (ulong)uVar11;
              lVar17 = lVar17 + uVar7;
            } while (0 < iVar14);
            uVar16 = (ulong)(uint)((int)uVar16 + (int)lVar17);
          }
          prVar10[uVar15] = uVar11 * wrk->x_sub + uVar18 * iVar14;
          uVar12 = (ulong)wrk->fx_scale * (ulong)-(uVar18 * iVar14) + 0x80000000 >> 0x20;
          uVar15 = uVar15 + uVar7;
        } while ((int)uVar15 < iVar13);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

static void RescalerImportRowShrink_SSE2(WebPRescaler* const wrk,
                                         const uint8_t* src) {
  const int x_sub = wrk->x_sub;
  int accum = 0;
  const __m128i zero = _mm_setzero_si128();
  const __m128i mult0 = _mm_set1_epi16(x_sub);
  const __m128i mult1 = _mm_set1_epi32(wrk->fx_scale);
  const __m128i rounder = _mm_set_epi32(0, ROUNDER, 0, ROUNDER);
  __m128i sum = zero;
  rescaler_t* frow = wrk->frow;
  const rescaler_t* const frow_end = wrk->frow + 4 * wrk->dst_width;

  if (wrk->num_channels != 4 || wrk->x_add > (x_sub << 7)) {
    WebPRescalerImportRowShrink_C(wrk, src);
    return;
  }
  assert(!WebPRescalerInputDone(wrk));
  assert(!wrk->x_expand);

  for (; frow < frow_end; frow += 4) {
    __m128i base = zero;
    accum += wrk->x_add;
    while (accum > 0) {
      const __m128i A = _mm_cvtsi32_si128(WebPMemToUint32(src));
      src += 4;
      base = _mm_unpacklo_epi8(A, zero);
      // To avoid overflow, we need: base * x_add / x_sub < 32768
      // => x_add < x_sub << 7. That's a 1/128 reduction ratio limit.
      sum = _mm_add_epi16(sum, base);
      accum -= x_sub;
    }
    {    // Emit next horizontal pixel.
      const __m128i mult = _mm_set1_epi16(-accum);
      const __m128i frac0 = _mm_mullo_epi16(base, mult);  // 16b x 16b -> 32b
      const __m128i frac1 = _mm_mulhi_epu16(base, mult);
      const __m128i frac = _mm_unpacklo_epi16(frac0, frac1);  // frac is 32b
      const __m128i A0 = _mm_mullo_epi16(sum, mult0);
      const __m128i A1 = _mm_mulhi_epu16(sum, mult0);
      const __m128i B0 = _mm_unpacklo_epi16(A0, A1);      // sum * x_sub
      const __m128i frow_out = _mm_sub_epi32(B0, frac);   // sum * x_sub - frac
      const __m128i D0 = _mm_srli_epi64(frac, 32);
      const __m128i D1 = _mm_mul_epu32(frac, mult1);      // 32b x 16b -> 64b
      const __m128i D2 = _mm_mul_epu32(D0, mult1);
      const __m128i E1 = _mm_add_epi64(D1, rounder);
      const __m128i E2 = _mm_add_epi64(D2, rounder);
      const __m128i F1 = _mm_shuffle_epi32(E1, 1 | (3 << 2));
      const __m128i F2 = _mm_shuffle_epi32(E2, 1 | (3 << 2));
      const __m128i G = _mm_unpacklo_epi32(F1, F2);
      sum = _mm_packs_epi32(G, zero);
      _mm_storeu_si128((__m128i*)frow, frow_out);
    }
  }
  assert(accum == 0);
}